

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

string * __thiscall
crsGA::LogHandler::buildOutpuMessage
          (string *__return_storage_ptr__,LogHandler *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *when,LogLevel level,string *str)

{
  ostream *poVar1;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  ostringstream local_1a8 [8];
  ostringstream msg;
  string *str_local;
  LogLevel level_local;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *when_local;
  LogHandler *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  switch(level) {
  case LOG_FATAL:
    poVar1 = std::operator<<((ostream *)local_1a8,"[");
    toDateTime_abi_cxx11_(&local_1d8,this,when);
    poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
    poVar1 = std::operator<<(poVar1,"] <FATAL>:");
    std::operator<<(poVar1,(string *)str);
    std::__cxx11::string::~string((string *)&local_1d8);
    break;
  case LOG_WARNING:
    poVar1 = std::operator<<((ostream *)local_1a8,"[");
    toDateTime_abi_cxx11_(&local_1f8,this,when);
    poVar1 = std::operator<<(poVar1,(string *)&local_1f8);
    poVar1 = std::operator<<(poVar1,"] <WARNING>: ");
    std::operator<<(poVar1,(string *)str);
    std::__cxx11::string::~string((string *)&local_1f8);
    break;
  case LOG_NOTICE:
    poVar1 = std::operator<<((ostream *)local_1a8,"[");
    toDateTime_abi_cxx11_(&local_218,this,when);
    poVar1 = std::operator<<(poVar1,(string *)&local_218);
    poVar1 = std::operator<<(poVar1,"] <NOTICE>:  ");
    std::operator<<(poVar1,(string *)str);
    std::__cxx11::string::~string((string *)&local_218);
    break;
  case LOG_DEBUG:
    poVar1 = std::operator<<((ostream *)local_1a8,"[");
    toDateTime_abi_cxx11_(&local_238,this,when);
    poVar1 = std::operator<<(poVar1,(string *)&local_238);
    poVar1 = std::operator<<(poVar1,"] <DEBUG>:   ");
    std::operator<<(poVar1,(string *)str);
    std::__cxx11::string::~string((string *)&local_238);
    break;
  case LOG_VERBOSE:
    poVar1 = std::operator<<((ostream *)local_1a8,"[");
    toDateTime_abi_cxx11_(&local_258,this,when);
    poVar1 = std::operator<<(poVar1,(string *)&local_258);
    poVar1 = std::operator<<(poVar1,"] <VERBOSE>: ");
    std::operator<<(poVar1,(string *)str);
    std::__cxx11::string::~string((string *)&local_258);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string LogHandler::buildOutpuMessage(const std::chrono::time_point<std::chrono::system_clock>& when, LogLevel level, const std::string& str)
{
    std::ostringstream msg;
    switch (level)
    {
    case LOG_FATAL:
        msg << "[" << toDateTime(when) << "] <FATAL>:" << str;
        break;
    case LOG_WARNING:
        msg << "[" << toDateTime(when) << "] <WARNING>: " << str;
        break;
    case LOG_NOTICE:
        msg << "[" << toDateTime(when) << "] <NOTICE>:  " << str;
        break;
    case LOG_DEBUG:
        msg << "[" << toDateTime(when) << "] <DEBUG>:   " << str;
        break;
    case LOG_VERBOSE:
        msg << "[" << toDateTime(when) << "] <VERBOSE>: " << str;
        break;
    default:
        break;
    }
    return msg.str();
}